

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int FreeEXRHeader(EXRHeader *exr_header)

{
  void *__ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (exr_header == (EXRHeader *)0x0) {
    iVar1 = -3;
  }
  else {
    if (exr_header->channels != (EXRChannelInfo *)0x0) {
      free(exr_header->channels);
    }
    if (exr_header->pixel_types != (int *)0x0) {
      free(exr_header->pixel_types);
    }
    if (exr_header->requested_pixel_types != (int *)0x0) {
      free(exr_header->requested_pixel_types);
    }
    iVar1 = exr_header->num_custom_attributes;
    if (0 < iVar1) {
      lVar2 = 0x200;
      lVar3 = 0;
      do {
        __ptr = *(void **)(exr_header->custom_attributes->name + lVar2);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          iVar1 = exr_header->num_custom_attributes;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x210;
      } while (lVar3 < iVar1);
    }
    iVar1 = 0;
    if (exr_header->custom_attributes != (EXRAttribute *)0x0) {
      free(exr_header->custom_attributes);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  if (exr_header->custom_attributes) {
    free(exr_header->custom_attributes);
  }

  return TINYEXR_SUCCESS;
}